

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSAtom JS_NewAtomInt64(JSContext *ctx,int64_t n)

{
  int iVar1;
  JSRuntime *in_RSI;
  JSValue v;
  JSValue val;
  char buf [24];
  char *in_stack_ffffffffffffffb8;
  JSContext *in_stack_ffffffffffffffc0;
  char local_38 [20];
  int in_stack_ffffffffffffffdc;
  JSString *in_stack_ffffffffffffffe0;
  JSAtom local_4;
  
  if (in_RSI < (JSRuntime *)0x80000000) {
    local_4 = __JS_AtomFromUInt32((uint32_t)in_RSI);
  }
  else {
    snprintf(local_38,0x18,"%ld",in_RSI);
    v = JS_NewString(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    iVar1 = JS_IsException(v);
    if (iVar1 == 0) {
      local_4 = __JS_NewAtom(in_RSI,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static JSAtom JS_NewAtomInt64(JSContext *ctx, int64_t n)
{
    if ((uint64_t)n <= JS_ATOM_MAX_INT) {
        return __JS_AtomFromUInt32((uint32_t)n);
    } else {
        char buf[24];
        JSValue val;
        snprintf(buf, sizeof(buf), "%" PRId64 , n);
        val = JS_NewString(ctx, buf);
        if (JS_IsException(val))
            return JS_ATOM_NULL;
        return __JS_NewAtom(ctx->rt, JS_VALUE_GET_STRING(val),
                            JS_ATOM_TYPE_STRING);
    }
}